

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QUnsortedModelEngine::filterOnDemand(QUnsortedModelEngine *this,int n)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  QIndexMapper *in_RDI;
  long in_FS_OFFSET;
  QUnsortedModelEngine *unaff_retaddr;
  int lastIndex;
  int lastRow;
  QAbstractItemModel *model;
  QIndexMapper im;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QMatchData *in_stack_ffffffffffffffd0;
  QMatchData *in_stack_ffffffffffffffd8;
  QIndexMapper *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  QModelIndex *in_stack_fffffffffffffff0;
  QString *str;
  
  str = *(QString **)(in_FS_OFFSET + 0x28);
  if (((ulong)in_RDI[1].vector.d.d & 0x100000000) != 0) {
    plVar3 = (long *)QAbstractProxyModel::sourceModel();
    iVar1 = (**(code **)(*plVar3 + 0x78))(plVar3,&in_RDI[3].vector.d.ptr);
    memset(&stack0xffffffffffffffd0,0xaa,0x28);
    QIndexMapper::last(in_RDI);
    QIndexMapper::QIndexMapper(in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    QList<QString>::constLast
              ((QList<QString> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    iVar2 = buildIndices(unaff_retaddr,str,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
                         in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    *(bool *)((long)&in_RDI[1].vector.d.d + 4) = iVar1 + -1 != iVar2;
    QList<QString>::constLast
              ((QList<QString> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QString::QString((QString *)in_RDI,
                     (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QCompletionEngine::saveInCache
              ((QCompletionEngine *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               (QString *)in_stack_ffffffffffffffe0,(QModelIndex *)in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0);
    QString::~QString((QString *)0xa6c39f);
    QIndexMapper::~QIndexMapper((QIndexMapper *)0xa6c3a9);
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) != str) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUnsortedModelEngine::filterOnDemand(int n)
{
    Q_ASSERT(matchCount());
    if (!curMatch.partial)
        return;
    Q_ASSERT(n >= -1);
    const QAbstractItemModel *model = c->proxy->sourceModel();
    int lastRow = model->rowCount(curParent) - 1;
    QIndexMapper im(curMatch.indices.last() + 1, lastRow);
    int lastIndex = buildIndices(curParts.constLast(), curParent, n, im, &curMatch);
    curMatch.partial = (lastRow != lastIndex);
    saveInCache(curParts.constLast(), curParent, curMatch);
}